

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall duckdb_re2::Compiler::Literal(Compiler *this,Rune r,bool foldcase)

{
  uint uVar1;
  ulong uVar3;
  Frag FVar4;
  Frag a;
  Frag b;
  uint8_t buf [4];
  uint32_t uStack_40;
  uint uStack_3c;
  Rune local_38;
  byte local_34 [4];
  undefined8 uVar2;
  
  local_38 = r;
  if (this->encoding_ == kEncodingUTF8) {
    if (0x7f < r) {
      uVar1 = runetochar((char *)local_34,&local_38);
      FVar4 = ByteRange(this,(uint)local_34[0],(uint)local_34[0],false);
      uVar2 = FVar4._0_8_;
      uStack_40 = FVar4.end.tail;
      uStack_3c = CONCAT31(uStack_3c._1_3_,FVar4.nullable);
      if (1 < (int)uVar1) {
        uVar3 = 1;
        do {
          a._12_4_ = uStack_3c;
          a.end.tail = uStack_40;
          FVar4 = ByteRange(this,(uint)local_34[uVar3],(uint)local_34[uVar3],false);
          b._8_8_ = FVar4._8_8_ & 0xffffffffff;
          a.begin = (int)uVar2;
          a.end.head = (int)((ulong)uVar2 >> 0x20);
          b.begin = (int)FVar4._0_8_;
          b.end.head = (int)((ulong)FVar4._0_8_ >> 0x20);
          FVar4 = Cat(this,a,b);
          uVar2 = FVar4._0_8_;
          uStack_40 = FVar4.end.tail;
          uStack_3c = CONCAT31(uStack_3c._1_3_,FVar4.nullable);
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      goto LAB_01c9ee92;
    }
  }
  else if (this->encoding_ != kEncodingLatin1) {
    uStack_40 = 0;
    uStack_3c = uStack_3c & 0xffffff00;
    uVar2 = 0;
    goto LAB_01c9ee92;
  }
  FVar4 = ByteRange(this,r,r,foldcase);
  uVar2 = FVar4._0_8_;
  uStack_40 = FVar4.end.tail;
  uStack_3c = CONCAT31(uStack_3c._1_3_,FVar4.nullable);
LAB_01c9ee92:
  FVar4._12_4_ = uStack_3c;
  FVar4.end.tail = uStack_40;
  FVar4.begin = (int)uVar2;
  FVar4.end.head = (int)((ulong)uVar2 >> 0x20);
  return FVar4;
}

Assistant:

Frag Compiler::Literal(Rune r, bool foldcase) {
  switch (encoding_) {
    default:
      return Frag();

    case kEncodingLatin1:
      return ByteRange(r, r, foldcase);

    case kEncodingUTF8: {
      if (r < Runeself)  // Make common case fast.
        return ByteRange(r, r, foldcase);
      uint8_t buf[UTFmax];
      int n = runetochar(reinterpret_cast<char*>(buf), &r);
      Frag f = ByteRange((uint8_t)buf[0], buf[0], false);
      for (int i = 1; i < n; i++)
        f = Cat(f, ByteRange((uint8_t)buf[i], buf[i], false));
      return f;
    }
  }
}